

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddCheck.c
# Opt level: O1

int Cudd_DebugCheck(DdManager *table)

{
  DdNode *pDVar1;
  undefined8 uVar2;
  int iVar3;
  int iVar4;
  st__table *psVar5;
  st__generator *gen;
  uint uVar6;
  long lVar7;
  uint *puVar8;
  ulong uVar9;
  DdNode **ppDVar10;
  DdNode **ppDVar11;
  int iVar12;
  uint uVar13;
  ulong uVar14;
  int count;
  DdManager *local_78;
  undefined1 local_6c [12];
  undefined8 local_60;
  DdNode **local_58;
  undefined8 local_50;
  long local_48;
  DdNode **local_40;
  long local_38;
  
  psVar5 = st__init_table(st__ptrcmp,st__ptrhash);
  iVar3 = -1;
  if (psVar5 != (st__table *)0x0) {
    if (table->size == 0) {
      iVar3 = 0;
    }
    else {
      uVar14 = 0;
      iVar3 = 0;
      do {
        local_58 = (DdNode **)(long)table->invperm[uVar14];
        if (uVar14 != (uint)table->perm[(long)local_58]) {
          fprintf((FILE *)table->err,"Permutation corrupted: invperm[%u] = %d\t perm[%d] = %d\n",
                  uVar14 & 0xffffffff,local_58,(ulong)(uint)table->invperm[uVar14]);
        }
        local_48 = uVar14 * 0x38;
        local_40 = (DdNode **)(long)(int)table->subtables[uVar14].slots;
        local_6c._4_8_ = uVar14;
        if ((long)local_40 < 1) {
          iVar12 = 0;
          local_60 = (st__table *)((ulong)local_60._4_4_ << 0x20);
        }
        else {
          local_50 = table->subtables[uVar14].nodelist;
          ppDVar11 = (DdNode **)0x0;
          local_60 = (st__table *)((ulong)local_60._4_4_ << 0x20);
          iVar12 = 0;
          do {
            for (local_78 = (DdManager *)local_50[(long)ppDVar11]; local_78 != table;
                local_78 = (DdManager *)(local_78->sentinel).next) {
              pDVar1 = (local_78->sentinel).type.kids.T;
              if (pDVar1 == (DdNode *)0x0) {
LAB_0090f07b:
                fwrite("Error: node has illegal Then or Else pointers\n",0x2e,1,(FILE *)table->err);
                puVar8 = (uint *)((ulong)local_78 & 0xfffffffffffffffe);
                fprintf((FILE *)table->err,
                        "       node 0x%lx, id = %u, ref = %u, then = 0x%lx, else = 0x%lx\n",puVar8,
                        (ulong)*puVar8,(ulong)puVar8[1],*(undefined8 *)(puVar8 + 4),
                        *(undefined8 *)(puVar8 + 6));
                iVar3 = 1;
              }
              else if (((local_78->sentinel).type.kids.E == (DdNode *)0x0) ||
                      ((local_78->sentinel).ref == 0)) {
                if ((pDVar1 == (DdNode *)0x0) ||
                   (((local_78->sentinel).type.kids.E == (DdNode *)0x0 ||
                    ((local_78->sentinel).ref != 0)))) goto LAB_0090f07b;
                local_60 = (st__table *)CONCAT44(local_60._4_4_,(int)local_60 + 1);
              }
              else {
                if ((local_78->sentinel).index != (DdHalfWord)local_58) {
                  fwrite("Error: node has illegal index\n",0x1e,1,(FILE *)table->err);
                  puVar8 = (uint *)((ulong)local_78 & 0xfffffffffffffffe);
                  fprintf((FILE *)table->err,
                          "       node 0x%lx, id = %u, ref = %u, then = 0x%lx, else = 0x%lx\n",
                          puVar8,(ulong)*puVar8,(ulong)puVar8[1],*(undefined8 *)(puVar8 + 4),
                          *(undefined8 *)(puVar8 + 6));
                  iVar3 = 1;
                }
                uVar14 = (ulong)((local_78->sentinel).type.kids.T)->index;
                uVar9 = 0x7fffffff;
                if (uVar14 != 0x7fffffff) {
                  uVar9 = (ulong)(uint)table->perm[uVar14];
                }
                if ((ulong)local_6c._4_8_ < uVar9) {
                  uVar14 = (ulong)*(uint *)((ulong)(local_78->sentinel).type.kids.E &
                                           0xfffffffffffffffe);
                  uVar9 = 0x7fffffff;
                  if (uVar14 != 0x7fffffff) {
                    uVar9 = (ulong)(uint)table->perm[uVar14];
                  }
                  if (uVar9 <= (ulong)local_6c._4_8_) goto LAB_0090ee5d;
                }
                else {
LAB_0090ee5d:
                  fwrite("Error: node has illegal children\n",0x21,1,(FILE *)table->err);
                  puVar8 = (uint *)((ulong)local_78 & 0xfffffffffffffffe);
                  fprintf((FILE *)table->err,
                          "       node 0x%lx, id = %u, ref = %u, then = 0x%lx, else = 0x%lx\n",
                          puVar8,(ulong)*puVar8,(ulong)puVar8[1],*(undefined8 *)(puVar8 + 4),
                          *(undefined8 *)(puVar8 + 6));
                  iVar3 = 1;
                }
                if ((undefined1  [16])
                    ((undefined1  [16])(local_78->sentinel).type & (undefined1  [16])0x1) !=
                    (undefined1  [16])0x0) {
                  fwrite("Error: node has illegal form\n",0x1d,1,(FILE *)table->err);
                  puVar8 = (uint *)((ulong)local_78 & 0xfffffffffffffffe);
                  fprintf((FILE *)table->err,
                          "       node 0x%lx, id = %u, ref = %u, then = 0x%lx, else = 0x%lx\n",
                          puVar8,(ulong)*puVar8,(ulong)puVar8[1],*(undefined8 *)(puVar8 + 4),
                          *(undefined8 *)(puVar8 + 6));
                  iVar3 = 1;
                }
                if ((local_78->sentinel).type.kids.T == (local_78->sentinel).type.kids.E) {
                  fwrite("Error: node has identical children\n",0x23,1,(FILE *)table->err);
                  puVar8 = (uint *)((ulong)local_78 & 0xfffffffffffffffe);
                  fprintf((FILE *)table->err,
                          "       node 0x%lx, id = %u, ref = %u, then = 0x%lx, else = 0x%lx\n",
                          puVar8,(ulong)*puVar8,(ulong)puVar8[1],*(undefined8 *)(puVar8 + 4),
                          *(undefined8 *)(puVar8 + 6));
                  iVar3 = 1;
                }
                if ((((local_78->sentinel).type.kids.T)->ref == 0) ||
                   (*(int *)(((ulong)(local_78->sentinel).type.kids.E & 0xfffffffffffffffe) + 4) ==
                    0)) {
                  fwrite("Error: live node has dead children\n",0x23,1,(FILE *)table->err);
                  puVar8 = (uint *)((ulong)local_78 & 0xfffffffffffffffe);
                  fprintf((FILE *)table->err,
                          "       node 0x%lx, id = %u, ref = %u, then = 0x%lx, else = 0x%lx\n",
                          puVar8,(ulong)*puVar8,(ulong)puVar8[1],*(undefined8 *)(puVar8 + 4),
                          *(undefined8 *)(puVar8 + 6));
                  iVar3 = 1;
                }
                iVar4 = st__lookup_int(psVar5,(char *)(local_78->sentinel).type.kids.T,
                                       (int *)local_6c);
                uVar6 = 1;
                if (iVar4 != 0) {
                  uVar6 = local_6c._0_4_ + 1;
                }
                local_6c._0_4_ = uVar6;
                iVar4 = st__insert(psVar5,(char *)(local_78->sentinel).type.kids.T,
                                   (char *)(long)(int)uVar6);
                if (iVar4 == -10000) goto LAB_0090f750;
                iVar4 = st__lookup_int(psVar5,(char *)((ulong)(local_78->sentinel).type.kids.E &
                                                      0xfffffffffffffffe),(int *)local_6c);
                uVar6 = 1;
                if (iVar4 != 0) {
                  uVar6 = local_6c._0_4_ + 1;
                }
                local_6c._0_4_ = uVar6;
                iVar4 = st__insert(psVar5,(char *)((ulong)(local_78->sentinel).type.kids.E &
                                                  0xfffffffffffffffe),(char *)(long)(int)uVar6);
                if (iVar4 == -10000) goto LAB_0090f750;
              }
              iVar12 = iVar12 + 1;
            }
            ppDVar11 = (DdNode **)((long)ppDVar11 + 1);
          } while (ppDVar11 != local_40);
        }
        lVar7 = local_48;
        if (iVar12 != *(int *)((long)&table->subtables->keys + local_48)) {
          fwrite("Error: wrong number of total nodes\n",0x23,1,(FILE *)table->err);
          iVar3 = 1;
        }
        uVar2 = local_6c._4_8_;
        if ((int)local_60 != *(int *)((long)&table->subtables->dead + lVar7)) {
          fwrite("Error: wrong number of dead nodes\n",0x22,1,(FILE *)table->err);
          iVar3 = 1;
        }
        uVar14 = uVar2 + 1;
      } while (uVar14 < (uint)table->size);
    }
    if (table->sizeZ != 0) {
      ppDVar11 = (DdNode **)0x0;
      do {
        local_6c._4_8_ = SEXT48(table->invpermZ[(long)ppDVar11]);
        if (ppDVar11 != (DdNode **)(ulong)(uint)table->permZ[local_6c._4_8_]) {
          fprintf((FILE *)table->err,
                  "Permutation corrupted: invpermZ[%u] = %d\t permZ[%d] = %d in ZDD\n",
                  (ulong)ppDVar11 & 0xffffffff,local_6c._4_8_,
                  (ulong)(uint)table->invpermZ[(long)ppDVar11]);
        }
        local_38 = (long)ppDVar11 * 0x38;
        local_48 = (long)(int)table->subtableZ[(long)ppDVar11].slots;
        if (local_48 < 1) {
          iVar12 = 0;
          local_50 = (DdNode **)((ulong)local_50._4_4_ << 0x20);
        }
        else {
          local_40 = table->subtableZ[(long)ppDVar11].nodelist;
          lVar7 = 0;
          local_50 = (DdNode **)((ulong)local_50._4_4_ << 0x20);
          iVar12 = 0;
          local_58 = ppDVar11;
          do {
            local_60 = (st__table *)lVar7;
            for (local_78 = (DdManager *)local_40[lVar7]; local_78 != (DdManager *)0x0;
                local_78 = (DdManager *)(local_78->sentinel).next) {
              pDVar1 = (local_78->sentinel).type.kids.T;
              if (pDVar1 == (DdNode *)0x0) {
LAB_0090f584:
                fwrite("Error: ZDD node has illegal Then or Else pointers\n",0x32,1,
                       (FILE *)table->err);
                puVar8 = (uint *)((ulong)local_78 & 0xfffffffffffffffe);
                fprintf((FILE *)table->err,
                        "       node 0x%lx, id = %u, ref = %u, then = 0x%lx, else = 0x%lx\n",puVar8,
                        (ulong)*puVar8,(ulong)puVar8[1],*(undefined8 *)(puVar8 + 4),
                        *(undefined8 *)(puVar8 + 6));
                iVar3 = 1;
              }
              else if (((local_78->sentinel).type.kids.E == (DdNode *)0x0) ||
                      ((local_78->sentinel).ref == 0)) {
                if ((pDVar1 == (DdNode *)0x0) ||
                   (((local_78->sentinel).type.kids.E == (DdNode *)0x0 ||
                    ((local_78->sentinel).ref != 0)))) goto LAB_0090f584;
                local_50 = (DdNode **)CONCAT44(local_50._4_4_,(int)local_50 + 1);
              }
              else {
                if ((local_78->sentinel).index != (DdHalfWord)local_6c._4_8_) {
                  fwrite("Error: ZDD node has illegal index\n",0x22,1,(FILE *)table->err);
                  puVar8 = (uint *)((ulong)local_78 & 0xfffffffffffffffe);
                  fprintf((FILE *)table->err,
                          "       node 0x%lx, id = %u, ref = %u, then = 0x%lx, else = 0x%lx\n",
                          puVar8,(ulong)*puVar8,(ulong)puVar8[1],*(undefined8 *)(puVar8 + 4),
                          *(undefined8 *)(puVar8 + 6));
                  iVar3 = 1;
                }
                if (((undefined1  [16])
                     ((undefined1  [16])(local_78->sentinel).type & (undefined1  [16])0x1) !=
                     (undefined1  [16])0x0) ||
                   ((undefined1  [16])
                    ((undefined1  [16])(local_78->sentinel).type & (undefined1  [16])0x1) !=
                    (undefined1  [16])0x0)) {
                  fwrite("Error: ZDD node has complemented children\n",0x2a,1,(FILE *)table->err);
                  puVar8 = (uint *)((ulong)local_78 & 0xfffffffffffffffe);
                  fprintf((FILE *)table->err,
                          "       node 0x%lx, id = %u, ref = %u, then = 0x%lx, else = 0x%lx\n",
                          puVar8,(ulong)*puVar8,(ulong)puVar8[1],*(undefined8 *)(puVar8 + 4),
                          *(undefined8 *)(puVar8 + 6));
                  iVar3 = 1;
                }
                uVar14 = (ulong)((local_78->sentinel).type.kids.T)->index;
                ppDVar10 = (DdNode **)0x7fffffff;
                if (uVar14 != 0x7fffffff) {
                  ppDVar10 = (DdNode **)(ulong)(uint)table->permZ[uVar14];
                }
                if (ppDVar11 < ppDVar10) {
                  uVar14 = (ulong)((local_78->sentinel).type.kids.E)->index;
                  ppDVar10 = (DdNode **)0x7fffffff;
                  if (uVar14 != 0x7fffffff) {
                    ppDVar10 = (DdNode **)(ulong)(uint)table->permZ[uVar14];
                  }
                  if (ppDVar10 <= ppDVar11) goto LAB_0090f364;
                }
                else {
LAB_0090f364:
                  fwrite("Error: ZDD node has illegal children\n",0x25,1,(FILE *)table->err);
                  puVar8 = (uint *)((ulong)local_78 & 0xfffffffffffffffe);
                  fprintf((FILE *)table->err,
                          "       node 0x%lx, id = %u, ref = %u, then = 0x%lx, else = 0x%lx\n",
                          puVar8,(ulong)*puVar8,(ulong)puVar8[1],*(undefined8 *)(puVar8 + 4),
                          *(undefined8 *)(puVar8 + 6));
                  puVar8 = (uint *)((ulong)(local_78->sentinel).type.kids.T & 0xfffffffffffffffe);
                  fprintf((FILE *)table->err,
                          "       node 0x%lx, id = %u, ref = %u, then = 0x%lx, else = 0x%lx\n",
                          puVar8,(ulong)*puVar8,(ulong)puVar8[1],*(undefined8 *)(puVar8 + 4),
                          *(undefined8 *)(puVar8 + 6));
                  puVar8 = (uint *)((ulong)(local_78->sentinel).type.kids.E & 0xfffffffffffffffe);
                  fprintf((FILE *)table->err,
                          "       node 0x%lx, id = %u, ref = %u, then = 0x%lx, else = 0x%lx\n",
                          puVar8,(ulong)*puVar8,(ulong)puVar8[1],*(undefined8 *)(puVar8 + 4),
                          *(undefined8 *)(puVar8 + 6));
                  iVar3 = 1;
                }
                if ((local_78->sentinel).type.kids.T == table->zero) {
                  fwrite("Error: ZDD node has zero then child\n",0x24,1,(FILE *)table->err);
                  puVar8 = (uint *)((ulong)local_78 & 0xfffffffffffffffe);
                  fprintf((FILE *)table->err,
                          "       node 0x%lx, id = %u, ref = %u, then = 0x%lx, else = 0x%lx\n",
                          puVar8,(ulong)*puVar8,(ulong)puVar8[1],*(undefined8 *)(puVar8 + 4),
                          *(undefined8 *)(puVar8 + 6));
                  iVar3 = 1;
                }
                if ((((local_78->sentinel).type.kids.T)->ref == 0) ||
                   (((local_78->sentinel).type.kids.E)->ref == 0)) {
                  fwrite("Error: ZDD live node has dead children\n",0x27,1,(FILE *)table->err);
                  puVar8 = (uint *)((ulong)local_78 & 0xfffffffffffffffe);
                  fprintf((FILE *)table->err,
                          "       node 0x%lx, id = %u, ref = %u, then = 0x%lx, else = 0x%lx\n",
                          puVar8,(ulong)*puVar8,(ulong)puVar8[1],*(undefined8 *)(puVar8 + 4),
                          *(undefined8 *)(puVar8 + 6));
                  iVar3 = 1;
                }
                iVar4 = st__lookup_int(psVar5,(char *)(local_78->sentinel).type.kids.T,
                                       (int *)local_6c);
                local_6c._0_4_ = local_6c._0_4_ + 1;
                if (iVar4 == 0) {
                  local_6c._0_4_ = 1;
                }
                iVar4 = st__insert(psVar5,(char *)(local_78->sentinel).type.kids.T,
                                   (char *)(long)(int)local_6c._0_4_);
                if (iVar4 == -10000) {
LAB_0090f750:
                  st__free_table(psVar5);
                  return -1;
                }
                iVar4 = st__lookup_int(psVar5,(char *)(local_78->sentinel).type.kids.E,
                                       (int *)local_6c);
                local_6c._0_4_ = local_6c._0_4_ + 1;
                if (iVar4 == 0) {
                  local_6c._0_4_ = 1;
                }
                iVar4 = st__insert(psVar5,(char *)(local_78->sentinel).type.kids.E,
                                   (char *)(long)(int)local_6c._0_4_);
                ppDVar11 = local_58;
                if (iVar4 == -10000) {
                  st__free_table(psVar5);
                  table->errorCode = CUDD_MEMORY_OUT;
                  return -1;
                }
              }
              iVar12 = iVar12 + 1;
            }
            lVar7 = (long)local_60 + 1;
          } while (lVar7 != local_48);
          local_78 = (DdManager *)0x0;
        }
        lVar7 = local_38;
        if (iVar12 != *(int *)((long)&table->subtableZ->keys + local_38)) {
          fwrite("Error: wrong number of total nodes in ZDD\n",0x2a,1,(FILE *)table->err);
          iVar3 = 1;
        }
        if ((int)local_50 != *(int *)((long)&table->subtableZ->dead + lVar7)) {
          fwrite("Error: wrong number of dead nodes in ZDD\n",0x29,1,(FILE *)table->err);
          iVar3 = 1;
        }
        ppDVar11 = (DdNode **)((long)ppDVar11 + 1);
      } while (ppDVar11 < (DdNode **)(ulong)(uint)table->sizeZ);
    }
    local_6c._4_8_ = SEXT48((int)(table->constants).slots);
    local_60 = psVar5;
    if ((long)local_6c._4_8_ < 1) {
      uVar13 = 0;
      uVar6 = 0;
    }
    else {
      local_58 = (table->constants).nodelist;
      lVar7 = 0;
      uVar6 = 0;
      uVar13 = 0;
      do {
        for (local_78 = (DdManager *)local_58[lVar7]; local_78 != (DdManager *)0x0;
            local_78 = (DdManager *)(local_78->sentinel).next) {
          if ((local_78->sentinel).ref == 0) {
            uVar6 = uVar6 + 1;
          }
          else if ((local_78->sentinel).index != 0x7fffffff) {
            fwrite("Error: node has illegal index\n",0x1e,1,(FILE *)table->err);
            fprintf((FILE *)table->err,"       node 0x%lx, id = %u, ref = %u, value = %g\n",
                    (int)*(undefined8 *)&(local_78->sentinel).type,local_78,
                    (ulong)(local_78->sentinel).index,(ulong)(local_78->sentinel).ref);
            iVar3 = 1;
          }
          uVar13 = uVar13 + 1;
        }
        lVar7 = lVar7 + 1;
      } while (lVar7 != local_6c._4_8_);
      local_78 = (DdManager *)0x0;
    }
    if (uVar13 != (table->constants).keys) {
      fwrite("Error: wrong number of total nodes in constants\n",0x30,1,(FILE *)table->err);
      iVar3 = 1;
    }
    psVar5 = local_60;
    if (uVar6 != (table->constants).dead) {
      fwrite("Error: wrong number of dead nodes in constants\n",0x2f,1,(FILE *)table->err);
      iVar3 = 1;
    }
    gen = st__init_gen(psVar5);
    iVar12 = st__gen(gen,(char **)&local_78,(char **)local_6c);
    if (iVar12 != 0) {
      do {
        uVar6 = (local_78->sentinel).ref;
        if (uVar6 != 0xffffffff && (int)uVar6 < (int)local_6c._0_4_) {
          fprintf((FILE *)table->err,
                  "ref count error at node 0x%lx, count = %d, id = %u, ref = %u, then = 0x%lx, else = 0x%lx\n"
                  ,local_78,(ulong)(uint)local_6c._0_4_,(ulong)(local_78->sentinel).index,
                  (ulong)uVar6,(local_78->sentinel).type.value,
                  *(undefined4 *)((long)&(local_78->sentinel).type + 8));
          debugFindParent(table,&local_78->sentinel);
          iVar3 = 1;
        }
        iVar12 = st__gen(gen,(char **)&local_78,(char **)local_6c);
      } while (iVar12 != 0);
    }
    st__free_gen(gen);
    st__free_table(psVar5);
  }
  return iVar3;
}

Assistant:

int
Cudd_DebugCheck(
  DdManager * table)
{
    unsigned int i;
    int         j,count;
    int         slots;
    DdNodePtr   *nodelist;
    DdNode      *f;
    DdNode      *sentinel = &(table->sentinel);
    st__table    *edgeTable;     /* stores internal ref count for each node */
    st__generator        *gen;
    int         flag = 0;
    int         totalNode;
    int         deadNode;
    int         index;


    edgeTable = st__init_table( st__ptrcmp, st__ptrhash);
    if (edgeTable == NULL) return(CUDD_OUT_OF_MEM);

    /* Check the BDD/ADD subtables. */
    for (i = 0; i < (unsigned) table->size; i++) {
        index = table->invperm[i];
        if (i != (unsigned) table->perm[index]) {
            (void) fprintf(table->err,
                           "Permutation corrupted: invperm[%u] = %d\t perm[%d] = %d\n",
                           i, index, index, table->perm[index]);
        }
        nodelist = table->subtables[i].nodelist;
        slots = table->subtables[i].slots;

        totalNode = 0;
        deadNode = 0;
        for (j = 0; j < slots; j++) {   /* for each subtable slot */
            f = nodelist[j];
            while (f != sentinel) {
                totalNode++;
                if (cuddT(f) != NULL && cuddE(f) != NULL && f->ref != 0) {
                    if ((int) f->index != index) {
                        (void) fprintf(table->err,
                                       "Error: node has illegal index\n");
                        cuddPrintNode(f,table->err);
                        flag = 1;
                    }
                    if ((unsigned) cuddI(table,cuddT(f)->index) <= i ||
                        (unsigned) cuddI(table,Cudd_Regular(cuddE(f))->index)
                        <= i) {
                        (void) fprintf(table->err,
                                       "Error: node has illegal children\n");
                        cuddPrintNode(f,table->err);
                        flag = 1;
                    }
                    if (Cudd_Regular(cuddT(f)) != cuddT(f)) {
                        (void) fprintf(table->err,
                                       "Error: node has illegal form\n");
                        cuddPrintNode(f,table->err);
                        flag = 1;
                    }
                    if (cuddT(f) == cuddE(f)) {
                        (void) fprintf(table->err,
                                       "Error: node has identical children\n");
                        cuddPrintNode(f,table->err);
                        flag = 1;
                    }
                    if (cuddT(f)->ref == 0 || Cudd_Regular(cuddE(f))->ref == 0) {
                        (void) fprintf(table->err,
                                       "Error: live node has dead children\n");
                        cuddPrintNode(f,table->err);
                        flag =1;
                    }
                    /* Increment the internal reference count for the
                    ** then child of the current node.
                    */
                    if ( st__lookup_int(edgeTable,(char *)cuddT(f),&count)) {
                        count++;
                    } else {
                        count = 1;
                    }
                    if ( st__insert(edgeTable,(char *)cuddT(f),
                    (char *)(long)count) == st__OUT_OF_MEM) {
                        st__free_table(edgeTable);
                        return(CUDD_OUT_OF_MEM);
                    }

                    /* Increment the internal reference count for the
                    ** else child of the current node.
                    */
                    if ( st__lookup_int(edgeTable,(char *)Cudd_Regular(cuddE(f)),
                                      &count)) {
                        count++;
                    } else {
                        count = 1;
                    }
                    if ( st__insert(edgeTable,(char *)Cudd_Regular(cuddE(f)),
                    (char *)(long)count) == st__OUT_OF_MEM) {
                        st__free_table(edgeTable);
                        return(CUDD_OUT_OF_MEM);
                    }
                } else if (cuddT(f) != NULL && cuddE(f) != NULL && f->ref == 0) {
                    deadNode++;
#if 0
                    debugCheckParent(table,f);
#endif
                } else {
                    fprintf(table->err,
                            "Error: node has illegal Then or Else pointers\n");
                    cuddPrintNode(f,table->err);
                    flag = 1;
                }

                f = f->next;
            }   /* for each element of the collision list */
        }       /* for each subtable slot */

        if ((unsigned) totalNode != table->subtables[i].keys) {
            fprintf(table->err,"Error: wrong number of total nodes\n");
            flag = 1;
        }
        if ((unsigned) deadNode != table->subtables[i].dead) {
            fprintf(table->err,"Error: wrong number of dead nodes\n");
            flag = 1;
        }
    }   /* for each BDD/ADD subtable */

    /* Check the ZDD subtables. */
    for (i = 0; i < (unsigned) table->sizeZ; i++) {
        index = table->invpermZ[i];
        if (i != (unsigned) table->permZ[index]) {
            (void) fprintf(table->err,
                           "Permutation corrupted: invpermZ[%u] = %d\t permZ[%d] = %d in ZDD\n",
                           i, index, index, table->permZ[index]);
        }
        nodelist = table->subtableZ[i].nodelist;
        slots = table->subtableZ[i].slots;

        totalNode = 0;
        deadNode = 0;
        for (j = 0; j < slots; j++) {   /* for each subtable slot */
            f = nodelist[j];
            while (f != NULL) {
                totalNode++;
                if (cuddT(f) != NULL && cuddE(f) != NULL && f->ref != 0) {
                    if ((int) f->index != index) {
                        (void) fprintf(table->err,
                                       "Error: ZDD node has illegal index\n");
                        cuddPrintNode(f,table->err);
                        flag = 1;
                    }
                    if (Cudd_IsComplement(cuddT(f)) ||
                        Cudd_IsComplement(cuddE(f))) {
                        (void) fprintf(table->err,
                                       "Error: ZDD node has complemented children\n");
                        cuddPrintNode(f,table->err);
                        flag = 1;
                    }
                    if ((unsigned) cuddIZ(table,cuddT(f)->index) <= i ||
                    (unsigned) cuddIZ(table,cuddE(f)->index) <= i) {
                        (void) fprintf(table->err,
                                       "Error: ZDD node has illegal children\n");
                        cuddPrintNode(f,table->err);
                        cuddPrintNode(cuddT(f),table->err);
                        cuddPrintNode(cuddE(f),table->err);
                        flag = 1;
                    }
                    if (cuddT(f) == DD_ZERO(table)) {
                        (void) fprintf(table->err,
                                       "Error: ZDD node has zero then child\n");
                        cuddPrintNode(f,table->err);
                        flag = 1;
                    }
                    if (cuddT(f)->ref == 0 || cuddE(f)->ref == 0) {
                        (void) fprintf(table->err,
                                       "Error: ZDD live node has dead children\n");
                        cuddPrintNode(f,table->err);
                        flag =1;
                    }
                    /* Increment the internal reference count for the
                    ** then child of the current node.
                    */
                    if ( st__lookup_int(edgeTable,(char *)cuddT(f),&count)) {
                        count++;
                    } else {
                        count = 1;
                    }
                    if ( st__insert(edgeTable,(char *)cuddT(f),
                    (char *)(long)count) == st__OUT_OF_MEM) {
                        st__free_table(edgeTable);
                        return(CUDD_OUT_OF_MEM);
                    }

                    /* Increment the internal reference count for the
                    ** else child of the current node.
                    */
                    if ( st__lookup_int(edgeTable,(char *)cuddE(f),&count)) {
                        count++;
                    } else {
                        count = 1;
                    }
                    if ( st__insert(edgeTable,(char *)cuddE(f),
                    (char *)(long)count) == st__OUT_OF_MEM) {
                        st__free_table(edgeTable);
                        table->errorCode = CUDD_MEMORY_OUT;
                        return(CUDD_OUT_OF_MEM);
                    }
                } else if (cuddT(f) != NULL && cuddE(f) != NULL && f->ref == 0) {
                    deadNode++;
#if 0
                    debugCheckParent(table,f);
#endif
                } else {
                    fprintf(table->err,
                            "Error: ZDD node has illegal Then or Else pointers\n");
                    cuddPrintNode(f,table->err);
                    flag = 1;
                }

                f = f->next;
            }   /* for each element of the collision list */
        }       /* for each subtable slot */

        if ((unsigned) totalNode != table->subtableZ[i].keys) {
            fprintf(table->err,
                    "Error: wrong number of total nodes in ZDD\n");
            flag = 1;
        }
        if ((unsigned) deadNode != table->subtableZ[i].dead) {
            fprintf(table->err,
                    "Error: wrong number of dead nodes in ZDD\n");
            flag = 1;
        }
    }   /* for each ZDD subtable */

    /* Check the constant table. */
    nodelist = table->constants.nodelist;
    slots = table->constants.slots;

    totalNode = 0;
    deadNode = 0;
    for (j = 0; j < slots; j++) {
        f = nodelist[j];
        while (f != NULL) {
            totalNode++;
            if (f->ref != 0) {
                if (f->index != CUDD_CONST_INDEX) {
                    fprintf(table->err,"Error: node has illegal index\n");
#if SIZEOF_VOID_P == 8
                    fprintf(table->err,
                            "       node 0x%lx, id = %u, ref = %u, value = %g\n",
                            (ptruint)f,f->index,f->ref,cuddV(f));
#else
                    fprintf(table->err,
                            "       node 0x%x, id = %hu, ref = %hu, value = %g\n",
                            (ptruint)f,f->index,f->ref,cuddV(f));
#endif
                    flag = 1;
                }
            } else {
                deadNode++;
            }
            f = f->next;
        }
    }
    if ((unsigned) totalNode != table->constants.keys) {
        (void) fprintf(table->err,
                       "Error: wrong number of total nodes in constants\n");
        flag = 1;
    }
    if ((unsigned) deadNode != table->constants.dead) {
        (void) fprintf(table->err,
                       "Error: wrong number of dead nodes in constants\n");
        flag = 1;
    }
    gen = st__init_gen(edgeTable);
    while ( st__gen(gen, (const char **)&f, (char **)&count)) {
        if (count > (int)(f->ref) && f->ref != DD_MAXREF) {
#if SIZEOF_VOID_P == 8
            fprintf(table->err,"ref count error at node 0x%lx, count = %d, id = %u, ref = %u, then = 0x%lx, else = 0x%lx\n",(ptruint)f,count,f->index,f->ref,(ptruint)cuddT(f),(ptruint)cuddE(f));
#else
            fprintf(table->err,"ref count error at node 0x%x, count = %d, id = %hu, ref = %hu, then = 0x%x, else = 0x%x\n",(ptruint)f,count,f->index,f->ref,(ptruint)cuddT(f),(ptruint)cuddE(f));
#endif
            debugFindParent(table,f);
            flag = 1;
        }
    }
    st__free_gen(gen);
    st__free_table(edgeTable);

    return (flag);

}